

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O1

bool Js::DateImplementation::TryParseDecimalDigits
               (char16 *str,size_t length,size_t startIndex,size_t numDigits,int *value)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ushort uVar6;
  ushort uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  
  if (str == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x297,"(str)","str");
    if (!bVar3) goto LAB_00b4c6b3;
    *puVar4 = 0;
  }
  if (length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x298,"(length)","length");
    if (!bVar3) goto LAB_00b4c6b3;
    *puVar4 = 0;
  }
  if (length < startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x299,"(startIndex <= length)","startIndex <= length");
    if (!bVar3) goto LAB_00b4c6b3;
    *puVar4 = 0;
  }
  if (8 < numDigits - 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x29a,"(numDigits != 0 && numDigits <= 9)",
                                "numDigits != 0 && numDigits <= 9");
    if (!bVar3) goto LAB_00b4c6b3;
    *puVar4 = 0;
  }
  if (numDigits <= length - startIndex) {
    uVar5 = numDigits + (numDigits == 0);
    uVar8 = 0;
    do {
      uVar9 = uVar8;
      if (str[startIndex + uVar8] != L'0') break;
      uVar8 = uVar8 + 1;
      uVar9 = uVar5;
    } while (uVar5 != uVar8);
    uVar10 = 0;
    bVar3 = uVar9 < numDigits;
    if (bVar3) {
      uVar6 = str[startIndex + uVar9] + L'￐';
      uVar7 = 0;
      if (uVar6 < 10) {
        uVar7 = uVar6;
      }
      uVar10 = (uint)uVar7;
      uVar2 = uVar10;
      uVar5 = uVar9;
      if (uVar6 < 10) {
        do {
          uVar10 = uVar2;
          uVar5 = uVar5 + 1;
          uVar9 = numDigits;
          if (numDigits == uVar5) break;
          uVar9 = uVar5;
          uVar2 = (uint)(ushort)(str[startIndex + uVar5] + L'￐') + uVar10 * 10;
        } while ((ushort)(str[startIndex + uVar5] + L'￐') < 10);
        bVar3 = uVar5 < numDigits;
      }
    }
    if (!bVar3) {
      if (uVar9 != numDigits) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                    ,0x2af,"(i == numDigits)","i == numDigits");
        if (!bVar3) {
LAB_00b4c6b3:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      *value = uVar10;
      if (length - startIndex <= uVar9) {
        return true;
      }
      return (ushort)(str[uVar9 + startIndex] + L'ￆ') < 0xfff6;
    }
  }
  return false;
}

Assistant:

bool DateImplementation::TryParseDecimalDigits(
        const char16 *const str,
        const size_t length,
        const size_t startIndex,
        const size_t numDigits,
        int &value)
    {
        Assert(str);
        Assert(length);
        Assert(startIndex <= length);
        Assert(numDigits != 0 && numDigits <= 9); // will fit in an 'int'

        if(numDigits > length - startIndex)
            return false;

        size_t i = 0;

        // Skip leading zeroes
        while(str[startIndex + i] == _u('0') && ++i < numDigits);

        // Parse remaining digits
        int v = 0;
        for(; i < numDigits; ++i)
        {
            const unsigned short d = str[startIndex + i] - _u('0');
            if(d > 9)
                break;
            v = v * 10 + d;
        }
        if(i < numDigits)
            return false;
        Assert(i == numDigits);
        value = v;

        // The next character must not be a digit
        return !(i < length - startIndex && static_cast<unsigned short>(str[startIndex + i] - _u('0')) <= 9);
    }